

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void AdditionHelper<unsigned_int,unsigned_long,4>::
     AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (uint *lhs,unsigned_long *rhs,uint *result)

{
  uint uVar1;
  ulong uVar2;
  undefined4 *in_RDX;
  long *in_RSI;
  uint *in_RDI;
  uint64_t tmp;
  
  uVar2 = (ulong)*in_RDI + *in_RSI;
  if (*in_RDI <= uVar2) {
    uVar1 = std::numeric_limits<unsigned_int>::max();
    if (uVar2 <= uVar1) {
      *in_RDX = (int)uVar2;
      return;
    }
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        //lhs std::uint64_t, rhs unsigned
        std::uint64_t tmp = (std::uint64_t)lhs + (std::uint64_t)rhs;

        // We added and it didn't get smaller
        if( tmp >= lhs && tmp <= std::numeric_limits<T>::max() )
        {
            result = (T)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }